

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall
CStructure::CopyMember(CStructure *this,CStructureEntry2 *item,aint newDefault,EType newDeltaType)

{
  CStructureEntry2 *this_00;
  EType newDeltaType_local;
  aint newDefault_local;
  CStructureEntry2 *item_local;
  CStructure *this_local;
  
  this_00 = (CStructureEntry2 *)operator_new(0x28);
  CStructureEntry2::CStructureEntry2
            (this_00,this->noffset,item->len,newDefault,newDeltaType,item->type);
  AddMember(this,this_00);
  return;
}

Assistant:

void CStructure::CopyMember(CStructureEntry2* item, aint newDefault, Relocation::EType newDeltaType) {
	AddMember(new CStructureEntry2(noffset, item->len, newDefault, newDeltaType, item->type));
}